

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::SocketWriter::CloseConnection(SocketWriter *this)

{
  GTestLog local_c;
  
  if (this->sockfd_ == -1) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x43c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition sockfd_ != -1 failed. ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "CloseConnection() can be called only when there is a connection.",0x40);
    GTestLog::~GTestLog(&local_c);
  }
  close(this->sockfd_);
  this->sockfd_ = -1;
  return;
}

Assistant:

void CloseConnection() {
      GTEST_CHECK_(sockfd_ != -1)
          << "CloseConnection() can be called only when there is a connection.";

      close(sockfd_);
      sockfd_ = -1;
    }